

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

bool __thiscall Minisat::SimpSolver::eliminate(SimpSolver *this,bool turn_off_elim)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  int *piVar5;
  int j;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  int i;
  long lVar9;
  ulong *puVar10;
  uint uVar11;
  uint uVar12;
  double dVar13;
  double dVar14;
  
  (this->super_Solver).systematic_branching_state = 1;
  bVar4 = true;
  if ((this->super_Solver).vardata.sz != 0) {
    if ((this->super_Solver).trail.sz != 0) {
      removeSatisfied(this);
    }
    iVar2 = (this->super_Solver).clauses.sz;
    bVar4 = eliminate_(this);
    if (bVar4) {
      piVar1 = &(this->super_Solver).trail.sz;
      piVar5 = piVar1;
      if ((this->super_Solver).trail_lim.sz != 0) {
        piVar5 = (this->super_Solver).trail_lim.data;
      }
      uVar12 = (this->super_Solver).clauses.sz;
      uVar11 = (int)(this->super_Solver).dec_vars - *piVar5;
      if (0 < (this->super_Solver).verbosity) {
        printf("c Reduced to %d vars, %d cls (grow=%d)\n",(ulong)uVar11,(ulong)uVar12,
               (ulong)(uint)this->grow);
      }
      if (((int)uVar11 < 10000) || (10.0 <= (double)(int)uVar12 / (double)(int)uVar11)) {
        bVar4 = true;
        if (0 < (this->super_Solver).verbosity) {
          bVar4 = true;
          printf("c No iterative elimination performed. (vars=%d, c/v ratio=%.1f)\n",(ulong)uVar11);
        }
      }
      else {
        iVar7 = 8;
        if (this->grow != 0) {
          iVar7 = this->grow * 2;
        }
        uVar12 = 0;
        while (this->grow = iVar7, iVar7 < 10000) {
          for (lVar9 = 0; iVar7 = (this->super_Solver).clauses.sz, lVar9 < iVar7; lVar9 = lVar9 + 1)
          {
            puVar10 = (ulong *)((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory +
                               (this->super_Solver).clauses.data[lVar9]);
            for (uVar6 = 0; uVar6 < *puVar10 >> 0x22; uVar6 = uVar6 + 1) {
              iVar7 = *(int *)((long)puVar10 + uVar6 * 4 + 8) >> 1;
              if ((iVar7 < (this->elim_heap).indices.sz) &&
                 (-1 < (this->elim_heap).indices.data[iVar7])) {
                Heap<Minisat::SimpSolver::ElimLt>::update(&this->elim_heap,iVar7);
              }
              else {
                Heap<Minisat::SimpSolver::ElimLt>::insert(&this->elim_heap,iVar7);
              }
            }
          }
          piVar5 = piVar1;
          if ((this->super_Solver).trail_lim.sz != 0) {
            piVar5 = (this->super_Solver).trail_lim.data;
          }
          uVar11 = (int)(this->super_Solver).dec_vars - *piVar5;
          bVar4 = eliminate_(this);
          if (!bVar4) {
            bVar4 = false;
            goto LAB_001269de;
          }
          piVar5 = piVar1;
          if ((this->super_Solver).trail_lim.sz != 0) {
            piVar5 = (this->super_Solver).trail_lim.data;
          }
          uVar8 = (int)(this->super_Solver).dec_vars - *piVar5;
          if (uVar11 == uVar8) break;
          uVar3 = (this->super_Solver).clauses.sz;
          dVar13 = (double)(int)uVar3 / (double)iVar7;
          dVar14 = (double)(int)uVar11 / (double)(int)uVar8;
          if (0 < (this->super_Solver).verbosity) {
            printf("c Reduced to %d vars, %d cls (grow=%d)\n",(ulong)uVar8,(ulong)uVar3,
                   (ulong)(uint)this->grow);
            printf("c cl_inc_rate=%.3f, var_dec_rate=%.3f\n",dVar13,dVar14);
          }
          uVar12 = uVar12 + 1;
          if ((iVar2 < (int)uVar3) || (dVar14 < dVar13)) break;
          iVar7 = this->grow * 2;
        }
        bVar4 = true;
LAB_001269de:
        if (0 < (this->super_Solver).verbosity) {
          printf("c No. effective iterative eliminations: %d\n",(ulong)uVar12);
        }
      }
    }
    else {
      bVar4 = false;
    }
  }
  vec<char>::clear(&this->touched,true);
  OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::clear
            (&this->occurs,true);
  vec<int>::clear(&this->n_occ,true);
  Heap<Minisat::SimpSolver::ElimLt>::clear(&this->elim_heap,true);
  Queue<unsigned_int>::clear(&this->subsumption_queue,true);
  this->use_simplification = false;
  (this->super_Solver).remove_satisfied = true;
  (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.field_0x14 = 0;
  Solver::rebuildOrderHeap(&this->super_Solver);
  (*(this->super_Solver)._vptr_Solver[2])(this);
  (this->super_Solver).systematic_branching_state = 0;
  return bVar4;
}

Assistant:

bool SimpSolver::eliminate(bool turn_off_elim)
{
    bool res = true;
    int iter = 0;
    int n_cls, n_cls_init, n_vars;

    systematic_branching_state = 1;

    if (nVars() == 0) goto cleanup; // User disabling preprocessing.

    // Get an initial number of clauses (more accurately).
    if (trail.size() != 0) removeSatisfied();
    n_cls_init = nClauses();

    res = eliminate_(); // The first, usual variable elimination of MiniSat.
    if (!res) goto cleanup;

    n_cls = nClauses();
    n_vars = nFreeVars();

    if (verbosity >= 1) printf("c Reduced to %d vars, %d cls (grow=%d)\n", n_vars, n_cls, grow);

    if ((double)n_cls / n_vars >= 10 || n_vars < 10000) {
        if (verbosity > 0)
            printf("c No iterative elimination performed. (vars=%d, c/v ratio=%.1f)\n", n_vars, (double)n_cls / n_vars);
        goto cleanup;
    }

    grow = grow ? grow * 2 : 8;
    for (; grow < 10000; grow *= 2) {
        // Rebuild elimination variable heap.
        for (int i = 0; i < clauses.size(); i++) {
            const Clause &c = ca[clauses[i]];
            for (int j = 0; j < c.size(); j++)
                if (!elim_heap.inHeap(var(c[j])))
                    elim_heap.insert(var(c[j]));
                else
                    elim_heap.update(var(c[j]));
        }

        int n_cls_last = nClauses();
        int n_vars_last = nFreeVars();

        res = eliminate_();
        if (!res || n_vars_last == nFreeVars()) break;
        iter++;

        int n_cls_now = nClauses();
        int n_vars_now = nFreeVars();

        double cl_inc_rate = (double)n_cls_now / n_cls_last;
        double var_dec_rate = (double)n_vars_last / n_vars_now;

        if (verbosity >= 1) {
            printf("c Reduced to %d vars, %d cls (grow=%d)\n", n_vars_now, n_cls_now, grow);
            printf("c cl_inc_rate=%.3f, var_dec_rate=%.3f\n", cl_inc_rate, var_dec_rate);
        }

        if (n_cls_now > n_cls_init || cl_inc_rate > var_dec_rate) break;
    }
    if (verbosity >= 1) printf("c No. effective iterative eliminations: %d\n", iter);

cleanup:
    touched.clear(true);
    occurs.clear(true);
    n_occ.clear(true);
    elim_heap.clear(true);
    subsumption_queue.clear(true);

    use_simplification = false;
    remove_satisfied = true;
    ca.extra_clause_field = false;

    // Force full cleanup (this is safe and desirable since it only happens once):
    rebuildOrderHeap();
    garbageCollect();

    systematic_branching_state = 0;
    return res;
}